

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

uint * __thiscall
google::protobuf::internal::UntypedMapBase::GetKey<unsigned_int>
          (UntypedMapBase *this,NodeBase *node)

{
  if (((this->type_info_).field_0x3 & 0xf) == 1) {
    return (uint *)(node + 1);
  }
  GetKey<unsigned_int>();
}

Assistant:

T* GetKey(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.key_type));
    return reinterpret_cast<T*>(node->GetVoidKey());
  }